

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLComment::ShallowClone(XMLComment *this,XMLDocument *doc)

{
  char *str;
  XMLNode *pXVar1;
  XMLComment *comment;
  XMLDocument *doc_local;
  XMLComment *this_local;
  
  comment = (XMLComment *)doc;
  if (doc == (XMLDocument *)0x0) {
    comment = (XMLComment *)(this->super_XMLNode)._document;
  }
  str = XMLNode::Value(&this->super_XMLNode);
  pXVar1 = &XMLDocument::NewComment((XMLDocument *)comment,str)->super_XMLNode;
  return pXVar1;
}

Assistant:

XMLNode* XMLComment::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLComment* comment = doc->NewComment( Value() );	// fixme: this will always allocate memory. Intern?
    return comment;
}